

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# metadata_test.cc
# Opt level: O0

void __thiscall
MetadataTest_GetMetadataFromImage_Test::TestBody(MetadataTest_GetMetadataFromImage_Test *this)

{
  bool bVar1;
  undefined1 uVar2;
  char *pcVar3;
  AssertionResult gtest_ar_12;
  AssertionResult gtest_ar_11;
  AssertionResult gtest_ar_10;
  AssertionResult gtest_ar_9;
  AssertionResult gtest_ar_8;
  AssertionResult gtest_ar_7;
  AssertionResult gtest_ar_6;
  AssertionResult gtest_ar_5;
  aom_metadata_t *metadata;
  AssertionResult gtest_ar_4;
  AssertionResult gtest_ar_3;
  AssertionResult gtest_ar_2;
  AssertionResult gtest_ar_1;
  AssertionResult gtest_ar;
  aom_image_t image;
  AssertHelper *in_stack_fffffffffffffbf0;
  AssertionResult *this_00;
  undefined4 in_stack_fffffffffffffbf8;
  aom_metadata_insert_flags_t in_stack_fffffffffffffbfc;
  char *in_stack_fffffffffffffc00;
  uint8_t *in_stack_fffffffffffffc08;
  int iVar4;
  AssertionResult *this_01;
  undefined4 in_stack_fffffffffffffc10;
  uint32_t in_stack_fffffffffffffc14;
  undefined4 uVar5;
  aom_image_t *in_stack_fffffffffffffc18;
  Type type;
  AssertHelper *in_stack_fffffffffffffc20;
  AssertionResult *this_02;
  Message *in_stack_fffffffffffffc68;
  AssertionResult *this_03;
  undefined7 in_stack_fffffffffffffc70;
  undefined1 in_stack_fffffffffffffc77;
  AssertionResult local_2c8 [2];
  undefined4 local_2a8;
  int local_2a4;
  AssertionResult local_2a0 [2];
  AssertionResult local_280 [2];
  undefined8 local_260;
  AssertionResult local_258 [2];
  undefined4 local_234;
  AssertionResult local_230 [2];
  undefined4 local_210;
  int local_20c;
  AssertionResult local_208 [2];
  AssertionResult local_1e8 [2];
  undefined8 local_1c8;
  AssertionResult local_1c0;
  aom_metadata_t *local_1b0;
  undefined8 local_198;
  aom_metadata_t *local_190;
  AssertionResult local_188 [2];
  undefined8 local_168;
  aom_metadata_t *local_160;
  AssertionResult local_158 [2];
  undefined8 local_138;
  aom_metadata_t *local_130;
  AssertionResult local_128 [2];
  undefined4 local_108;
  int local_104;
  AssertionResult local_100;
  uint local_ec;
  undefined4 local_c8;
  int local_c4;
  AssertionResult local_c0;
  aom_image_t local_b0;
  
  local_b0.metadata = (aom_metadata_array_t *)0x0;
  local_c4 = aom_img_add_metadata
                       (in_stack_fffffffffffffc18,in_stack_fffffffffffffc14,
                        in_stack_fffffffffffffc08,(size_t)in_stack_fffffffffffffc00,
                        in_stack_fffffffffffffbfc);
  local_c8 = 0;
  testing::internal::EqHelper::Compare<int,_int,_nullptr>
            ((char *)in_stack_fffffffffffffc08,in_stack_fffffffffffffc00,
             (int *)CONCAT44(in_stack_fffffffffffffbfc,in_stack_fffffffffffffbf8),
             (int *)in_stack_fffffffffffffbf0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_c0);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_fffffffffffffc20);
    testing::AssertionResult::failure_message((AssertionResult *)0xbae321);
    testing::internal::AssertHelper::AssertHelper
              (in_stack_fffffffffffffc20,(Type)((ulong)in_stack_fffffffffffffc18 >> 0x20),
               (char *)CONCAT44(in_stack_fffffffffffffc14,in_stack_fffffffffffffc10),
               (int)((ulong)in_stack_fffffffffffffc08 >> 0x20),in_stack_fffffffffffffc00);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)CONCAT17(in_stack_fffffffffffffc77,in_stack_fffffffffffffc70),
               in_stack_fffffffffffffc68);
    testing::internal::AssertHelper::~AssertHelper(in_stack_fffffffffffffbf0);
    testing::Message::~Message((Message *)0xbae384);
  }
  local_ec = (uint)!bVar1;
  testing::AssertionResult::~AssertionResult((AssertionResult *)0xbae3f2);
  if (local_ec == 0) {
    local_104 = aom_img_add_metadata
                          (in_stack_fffffffffffffc18,in_stack_fffffffffffffc14,
                           in_stack_fffffffffffffc08,(size_t)in_stack_fffffffffffffc00,
                           in_stack_fffffffffffffbfc);
    type = (Type)((ulong)in_stack_fffffffffffffc18 >> 0x20);
    local_108 = 0;
    testing::internal::EqHelper::Compare<int,_int,_nullptr>
              ((char *)in_stack_fffffffffffffc08,in_stack_fffffffffffffc00,
               (int *)CONCAT44(in_stack_fffffffffffffbfc,in_stack_fffffffffffffbf8),
               (int *)in_stack_fffffffffffffbf0);
    bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_100);
    if (!bVar1) {
      testing::Message::Message((Message *)in_stack_fffffffffffffc20);
      testing::AssertionResult::failure_message((AssertionResult *)0xbae4dc);
      testing::internal::AssertHelper::AssertHelper
                (in_stack_fffffffffffffc20,type,
                 (char *)CONCAT44(in_stack_fffffffffffffc14,in_stack_fffffffffffffc10),
                 (int)((ulong)in_stack_fffffffffffffc08 >> 0x20),in_stack_fffffffffffffc00);
      testing::internal::AssertHelper::operator=
                ((AssertHelper *)CONCAT17(in_stack_fffffffffffffc77,in_stack_fffffffffffffc70),
                 in_stack_fffffffffffffc68);
      testing::internal::AssertHelper::~AssertHelper(in_stack_fffffffffffffbf0);
      testing::Message::~Message((Message *)0xbae53f);
    }
    local_ec = (uint)!bVar1;
    testing::AssertionResult::~AssertionResult((AssertionResult *)0xbae5ad);
    if (local_ec == 0) {
      local_130 = aom_img_get_metadata((aom_image_t *)0x0,0);
      local_138 = 0;
      testing::internal::EqHelper::Compare<const_aom_metadata_*,_std::nullptr_t,_nullptr>
                ((char *)in_stack_fffffffffffffc08,in_stack_fffffffffffffc00,
                 (aom_metadata **)CONCAT44(in_stack_fffffffffffffbfc,in_stack_fffffffffffffbf8),
                 &in_stack_fffffffffffffbf0->data_);
      bVar1 = testing::AssertionResult::operator_cast_to_bool(local_128);
      if (!bVar1) {
        testing::Message::Message((Message *)in_stack_fffffffffffffc20);
        testing::AssertionResult::failure_message((AssertionResult *)0xbae681);
        testing::internal::AssertHelper::AssertHelper
                  (in_stack_fffffffffffffc20,type,
                   (char *)CONCAT44(in_stack_fffffffffffffc14,in_stack_fffffffffffffc10),
                   (int)((ulong)in_stack_fffffffffffffc08 >> 0x20),in_stack_fffffffffffffc00);
        testing::internal::AssertHelper::operator=
                  ((AssertHelper *)CONCAT17(in_stack_fffffffffffffc77,in_stack_fffffffffffffc70),
                   in_stack_fffffffffffffc68);
        testing::internal::AssertHelper::~AssertHelper(in_stack_fffffffffffffbf0);
        testing::Message::~Message((Message *)0xbae6e4);
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)0xbae73c);
      local_160 = aom_img_get_metadata(&local_b0,2);
      local_168 = 0;
      testing::internal::EqHelper::Compare<const_aom_metadata_*,_std::nullptr_t,_nullptr>
                ((char *)in_stack_fffffffffffffc08,in_stack_fffffffffffffc00,
                 (aom_metadata **)CONCAT44(in_stack_fffffffffffffbfc,in_stack_fffffffffffffbf8),
                 &in_stack_fffffffffffffbf0->data_);
      bVar1 = testing::AssertionResult::operator_cast_to_bool(local_158);
      if (!bVar1) {
        testing::Message::Message((Message *)in_stack_fffffffffffffc20);
        testing::AssertionResult::failure_message((AssertionResult *)0xbae804);
        testing::internal::AssertHelper::AssertHelper
                  (in_stack_fffffffffffffc20,type,
                   (char *)CONCAT44(in_stack_fffffffffffffc14,in_stack_fffffffffffffc10),
                   (int)((ulong)in_stack_fffffffffffffc08 >> 0x20),in_stack_fffffffffffffc00);
        testing::internal::AssertHelper::operator=
                  ((AssertHelper *)CONCAT17(in_stack_fffffffffffffc77,in_stack_fffffffffffffc70),
                   in_stack_fffffffffffffc68);
        testing::internal::AssertHelper::~AssertHelper(in_stack_fffffffffffffbf0);
        testing::Message::~Message((Message *)0xbae867);
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)0xbae8bf);
      local_190 = aom_img_get_metadata(&local_b0,10);
      local_198 = 0;
      testing::internal::EqHelper::Compare<const_aom_metadata_*,_std::nullptr_t,_nullptr>
                ((char *)in_stack_fffffffffffffc08,in_stack_fffffffffffffc00,
                 (aom_metadata **)CONCAT44(in_stack_fffffffffffffbfc,in_stack_fffffffffffffbf8),
                 &in_stack_fffffffffffffbf0->data_);
      bVar1 = testing::AssertionResult::operator_cast_to_bool(local_188);
      if (!bVar1) {
        testing::Message::Message((Message *)in_stack_fffffffffffffc20);
        testing::AssertionResult::failure_message((AssertionResult *)0xbae987);
        testing::internal::AssertHelper::AssertHelper
                  (in_stack_fffffffffffffc20,type,
                   (char *)CONCAT44(in_stack_fffffffffffffc14,in_stack_fffffffffffffc10),
                   (int)((ulong)in_stack_fffffffffffffc08 >> 0x20),in_stack_fffffffffffffc00);
        testing::internal::AssertHelper::operator=
                  ((AssertHelper *)CONCAT17(in_stack_fffffffffffffc77,in_stack_fffffffffffffc70),
                   in_stack_fffffffffffffc68);
        testing::internal::AssertHelper::~AssertHelper(in_stack_fffffffffffffbf0);
        testing::Message::~Message((Message *)0xbae9ea);
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)0xbaea42);
      local_1b0 = aom_img_get_metadata(&local_b0,0);
      local_1c8 = 0;
      testing::internal::CmpHelperNE<aom_metadata_const*,decltype(nullptr)>
                ((char *)in_stack_fffffffffffffc08,in_stack_fffffffffffffc00,
                 (aom_metadata **)CONCAT44(in_stack_fffffffffffffbfc,in_stack_fffffffffffffbf8),
                 &in_stack_fffffffffffffbf0->data_);
      bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_1c0);
      if (!bVar1) {
        testing::Message::Message((Message *)in_stack_fffffffffffffc20);
        testing::AssertionResult::failure_message((AssertionResult *)0xbaeb09);
        testing::internal::AssertHelper::AssertHelper
                  (in_stack_fffffffffffffc20,type,
                   (char *)CONCAT44(in_stack_fffffffffffffc14,in_stack_fffffffffffffc10),
                   (int)((ulong)in_stack_fffffffffffffc08 >> 0x20),in_stack_fffffffffffffc00);
        testing::internal::AssertHelper::operator=
                  ((AssertHelper *)CONCAT17(in_stack_fffffffffffffc77,in_stack_fffffffffffffc70),
                   in_stack_fffffffffffffc68);
        testing::internal::AssertHelper::~AssertHelper(in_stack_fffffffffffffbf0);
        testing::Message::~Message((Message *)0xbaeb6c);
      }
      local_ec = (uint)!bVar1;
      testing::AssertionResult::~AssertionResult((AssertionResult *)0xbaebda);
      if (local_ec == 0) {
        testing::internal::EqHelper::Compare<unsigned_long,_unsigned_long,_nullptr>
                  ((char *)in_stack_fffffffffffffc08,in_stack_fffffffffffffc00,
                   (unsigned_long *)CONCAT44(in_stack_fffffffffffffbfc,in_stack_fffffffffffffbf8),
                   (unsigned_long *)in_stack_fffffffffffffbf0);
        bVar1 = testing::AssertionResult::operator_cast_to_bool(local_1e8);
        if (!bVar1) {
          testing::Message::Message((Message *)in_stack_fffffffffffffc20);
          testing::AssertionResult::failure_message((AssertionResult *)0xbaec91);
          testing::internal::AssertHelper::AssertHelper
                    (in_stack_fffffffffffffc20,type,
                     (char *)CONCAT44(in_stack_fffffffffffffc14,in_stack_fffffffffffffc10),
                     (int)((ulong)in_stack_fffffffffffffc08 >> 0x20),in_stack_fffffffffffffc00);
          testing::internal::AssertHelper::operator=
                    ((AssertHelper *)CONCAT17(in_stack_fffffffffffffc77,in_stack_fffffffffffffc70),
                     in_stack_fffffffffffffc68);
          testing::internal::AssertHelper::~AssertHelper(in_stack_fffffffffffffbf0);
          testing::Message::~Message((Message *)0xbaecf4);
        }
        local_ec = (uint)!bVar1;
        testing::AssertionResult::~AssertionResult((AssertionResult *)0xbaed62);
        if (local_ec == 0) {
          local_20c = memcmp((anonymous_namespace)::kMetadataPayloadT35,local_1b0->payload,0x18);
          local_210 = 0;
          this_03 = local_208;
          testing::internal::EqHelper::Compare<int,_int,_nullptr>
                    ((char *)in_stack_fffffffffffffc08,in_stack_fffffffffffffc00,
                     (int *)CONCAT44(in_stack_fffffffffffffbfc,in_stack_fffffffffffffbf8),
                     (int *)in_stack_fffffffffffffbf0);
          uVar2 = testing::AssertionResult::operator_cast_to_bool(this_03);
          if (!(bool)uVar2) {
            testing::Message::Message((Message *)in_stack_fffffffffffffc20);
            testing::AssertionResult::failure_message((AssertionResult *)0xbaee45);
            testing::internal::AssertHelper::AssertHelper
                      (in_stack_fffffffffffffc20,type,
                       (char *)CONCAT44(in_stack_fffffffffffffc14,in_stack_fffffffffffffc10),
                       (int)((ulong)in_stack_fffffffffffffc08 >> 0x20),in_stack_fffffffffffffc00);
            testing::internal::AssertHelper::operator=
                      ((AssertHelper *)CONCAT17(uVar2,in_stack_fffffffffffffc70),(Message *)this_03)
            ;
            testing::internal::AssertHelper::~AssertHelper(in_stack_fffffffffffffbf0);
            testing::Message::~Message((Message *)0xbaeea2);
          }
          testing::AssertionResult::~AssertionResult((AssertionResult *)0xbaeef7);
          local_234 = 2;
          testing::internal::EqHelper::
          Compare<aom_metadata_insert_flags,_aom_metadata_insert_flags,_nullptr>
                    ((char *)in_stack_fffffffffffffc08,in_stack_fffffffffffffc00,
                     (aom_metadata_insert_flags *)
                     CONCAT44(in_stack_fffffffffffffbfc,in_stack_fffffffffffffbf8),
                     (aom_metadata_insert_flags *)in_stack_fffffffffffffbf0);
          bVar1 = testing::AssertionResult::operator_cast_to_bool(local_230);
          if (!bVar1) {
            testing::Message::Message((Message *)in_stack_fffffffffffffc20);
            testing::AssertionResult::failure_message((AssertionResult *)0xbaef9c);
            testing::internal::AssertHelper::AssertHelper
                      (in_stack_fffffffffffffc20,type,
                       (char *)CONCAT44(in_stack_fffffffffffffc14,in_stack_fffffffffffffc10),
                       (int)((ulong)in_stack_fffffffffffffc08 >> 0x20),in_stack_fffffffffffffc00);
            testing::internal::AssertHelper::operator=
                      ((AssertHelper *)CONCAT17(uVar2,in_stack_fffffffffffffc70),(Message *)this_03)
            ;
            testing::internal::AssertHelper::~AssertHelper(in_stack_fffffffffffffbf0);
            testing::Message::~Message((Message *)0xbaeff9);
          }
          testing::AssertionResult::~AssertionResult((AssertionResult *)0xbaf051);
          local_1b0 = aom_img_get_metadata(&local_b0,1);
          local_260 = 0;
          testing::internal::CmpHelperNE<aom_metadata_const*,decltype(nullptr)>
                    ((char *)in_stack_fffffffffffffc08,in_stack_fffffffffffffc00,
                     (aom_metadata **)CONCAT44(in_stack_fffffffffffffbfc,in_stack_fffffffffffffbf8),
                     &in_stack_fffffffffffffbf0->data_);
          bVar1 = testing::AssertionResult::operator_cast_to_bool(local_258);
          if (!bVar1) {
            testing::Message::Message((Message *)in_stack_fffffffffffffc20);
            testing::AssertionResult::failure_message((AssertionResult *)0xbaf10d);
            testing::internal::AssertHelper::AssertHelper
                      (in_stack_fffffffffffffc20,type,
                       (char *)CONCAT44(in_stack_fffffffffffffc14,in_stack_fffffffffffffc10),
                       (int)((ulong)in_stack_fffffffffffffc08 >> 0x20),in_stack_fffffffffffffc00);
            testing::internal::AssertHelper::operator=
                      ((AssertHelper *)CONCAT17(uVar2,in_stack_fffffffffffffc70),(Message *)this_03)
            ;
            testing::internal::AssertHelper::~AssertHelper(in_stack_fffffffffffffbf0);
            testing::Message::~Message((Message *)0xbaf16a);
          }
          local_ec = (uint)!bVar1;
          testing::AssertionResult::~AssertionResult((AssertionResult *)0xbaf1d5);
          if (local_ec == 0) {
            this_02 = local_280;
            testing::internal::EqHelper::Compare<unsigned_long,_unsigned_long,_nullptr>
                      ((char *)in_stack_fffffffffffffc08,in_stack_fffffffffffffc00,
                       (unsigned_long *)
                       CONCAT44(in_stack_fffffffffffffbfc,in_stack_fffffffffffffbf8),
                       (unsigned_long *)in_stack_fffffffffffffbf0);
            iVar4 = (int)((ulong)in_stack_fffffffffffffc08 >> 0x20);
            bVar1 = testing::AssertionResult::operator_cast_to_bool(this_02);
            if (!bVar1) {
              testing::Message::Message((Message *)this_02);
              pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)0xbaf280);
              type = (Type)((ulong)pcVar3 >> 0x20);
              testing::internal::AssertHelper::AssertHelper
                        ((AssertHelper *)this_02,type,
                         (char *)CONCAT44(in_stack_fffffffffffffc14,in_stack_fffffffffffffc10),iVar4
                         ,in_stack_fffffffffffffc00);
              testing::internal::AssertHelper::operator=
                        ((AssertHelper *)CONCAT17(uVar2,in_stack_fffffffffffffc70),
                         (Message *)this_03);
              testing::internal::AssertHelper::~AssertHelper(in_stack_fffffffffffffbf0);
              testing::Message::~Message((Message *)0xbaf2dd);
            }
            local_ec = (uint)!bVar1;
            testing::AssertionResult::~AssertionResult((AssertionResult *)0xbaf34b);
            if (local_ec == 0) {
              local_2a4 = memcmp((anonymous_namespace)::kMetadataPayloadT35,local_1b0->payload,0x18)
              ;
              local_2a8 = 0;
              this_01 = local_2a0;
              testing::internal::EqHelper::Compare<int,_int,_nullptr>
                        (&this_01->success_,in_stack_fffffffffffffc00,
                         (int *)CONCAT44(in_stack_fffffffffffffbfc,in_stack_fffffffffffffbf8),
                         (int *)in_stack_fffffffffffffbf0);
              bVar1 = testing::AssertionResult::operator_cast_to_bool(this_01);
              uVar5 = CONCAT13(bVar1,(int3)in_stack_fffffffffffffc14);
              if (!bVar1) {
                testing::Message::Message((Message *)this_02);
                in_stack_fffffffffffffc00 =
                     testing::AssertionResult::failure_message((AssertionResult *)0xbaf422);
                testing::internal::AssertHelper::AssertHelper
                          ((AssertHelper *)this_02,type,
                           (char *)CONCAT44(uVar5,in_stack_fffffffffffffc10),
                           (int)((ulong)this_01 >> 0x20),in_stack_fffffffffffffc00);
                testing::internal::AssertHelper::operator=
                          ((AssertHelper *)CONCAT17(uVar2,in_stack_fffffffffffffc70),
                           (Message *)this_03);
                testing::internal::AssertHelper::~AssertHelper(in_stack_fffffffffffffbf0);
                testing::Message::~Message((Message *)0xbaf47f);
              }
              testing::AssertionResult::~AssertionResult((AssertionResult *)0xbaf4d4);
              this_00 = local_2c8;
              testing::internal::EqHelper::
              Compare<aom_metadata_insert_flags,_aom_metadata_insert_flags,_nullptr>
                        (&this_01->success_,in_stack_fffffffffffffc00,
                         (aom_metadata_insert_flags *)
                         CONCAT44(in_stack_fffffffffffffbfc,in_stack_fffffffffffffbf8),
                         (aom_metadata_insert_flags *)this_00);
              iVar4 = (int)((ulong)this_01 >> 0x20);
              bVar1 = testing::AssertionResult::operator_cast_to_bool(this_00);
              if (!bVar1) {
                testing::Message::Message((Message *)this_02);
                testing::AssertionResult::failure_message((AssertionResult *)0xbaf579);
                testing::internal::AssertHelper::AssertHelper
                          ((AssertHelper *)this_02,type,
                           (char *)CONCAT44(uVar5,in_stack_fffffffffffffc10),iVar4,
                           in_stack_fffffffffffffc00);
                testing::internal::AssertHelper::operator=
                          ((AssertHelper *)CONCAT17(uVar2,in_stack_fffffffffffffc70),
                           (Message *)this_03);
                testing::internal::AssertHelper::~AssertHelper((AssertHelper *)this_00);
                testing::Message::~Message((Message *)0xbaf5d4);
              }
              testing::AssertionResult::~AssertionResult((AssertionResult *)0xbaf629);
              aom_img_metadata_array_free((aom_metadata_array_t *)this_00);
            }
          }
        }
      }
    }
  }
  return;
}

Assistant:

TEST(MetadataTest, GetMetadataFromImage) {
  aom_image_t image;
  image.metadata = nullptr;

  ASSERT_EQ(aom_img_add_metadata(&image, OBU_METADATA_TYPE_ITUT_T35,
                                 kMetadataPayloadT35, kMetadataPayloadSizeT35,
                                 AOM_MIF_ANY_FRAME),
            0);
  ASSERT_EQ(aom_img_add_metadata(&image, OBU_METADATA_TYPE_ITUT_T35,
                                 kMetadataPayloadT35, kMetadataPayloadSizeT35,
                                 AOM_MIF_ANY_FRAME_LAYER_SPECIFIC),
            0);

  EXPECT_EQ(aom_img_get_metadata(nullptr, 0), nullptr);
  EXPECT_EQ(aom_img_get_metadata(&image, 2u), nullptr);
  EXPECT_EQ(aom_img_get_metadata(&image, 10u), nullptr);

  const aom_metadata_t *metadata = aom_img_get_metadata(&image, 0);
  ASSERT_NE(metadata, nullptr);
  ASSERT_EQ(metadata->sz, kMetadataPayloadSizeT35);
  EXPECT_EQ(
      memcmp(kMetadataPayloadT35, metadata->payload, kMetadataPayloadSizeT35),
      0);
  EXPECT_EQ(metadata->insert_flag, AOM_MIF_ANY_FRAME);

  metadata = aom_img_get_metadata(&image, 1);
  ASSERT_NE(metadata, nullptr);
  ASSERT_EQ(metadata->sz, kMetadataPayloadSizeT35);
  EXPECT_EQ(
      memcmp(kMetadataPayloadT35, metadata->payload, kMetadataPayloadSizeT35),
      0);
  EXPECT_EQ(metadata->insert_flag, AOM_MIF_ANY_FRAME_LAYER_SPECIFIC);

  aom_img_metadata_array_free(image.metadata);
}